

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O3

void __thiscall gui::Container::addWidgetUnderMouse(Container *this,Vector2f *mouseParent)

{
  Transform *this_00;
  Widget *pWVar1;
  Vector2f mouseLocal;
  Vector2f local_20;
  
  Widget::addWidgetUnderMouse(&this->super_Widget,mouseParent);
  this_00 = Widget::getInverseTransform(&this->super_Widget);
  local_20 = sf::Transform::transformPoint(this_00,mouseParent);
  pWVar1 = ContainerBase::getWidgetUnderMouse(&this->super_ContainerBase,&local_20);
  if (pWVar1 != (Widget *)0x0) {
    (*(pWVar1->super_Drawable)._vptr_Drawable[0x11])(pWVar1,&local_20);
  }
  return;
}

Assistant:

void Container::addWidgetUnderMouse(const sf::Vector2f& mouseParent) {
    Widget::addWidgetUnderMouse(mouseParent);
    auto mouseLocal = toLocalSpace(mouseParent);
    auto widget = getWidgetUnderMouse(mouseLocal);
    if (widget != nullptr) {
        widget->addWidgetUnderMouse(mouseLocal);
    }
}